

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O3

uint64_t lzma_lz_encoder_memusage(lzma_lz_options_conflict *lz_options)

{
  _Bool _Var1;
  uint64_t uVar2;
  lzma_mf mf;
  lzma_mf local_78;
  
  local_78.nice_len = 0;
  local_78.match_len_max = 0;
  local_78.action = LZMA_RUN;
  local_78.hash_size_sum = 0;
  local_78.cyclic_pos = 0;
  local_78.cyclic_size = 0;
  local_78.hash_mask = 0;
  local_78.depth = 0;
  local_78.hash = (uint32_t *)0x0;
  local_78.son = (uint32_t *)0x0;
  local_78.find = (_func_uint32_t_lzma_mf_ptr_lzma_match_ptr *)0x0;
  local_78.skip = (_func_void_lzma_mf_ptr_uint32_t *)0x0;
  local_78.read_limit = 0;
  local_78.write_pos = 0;
  local_78.pending = 0;
  local_78._44_4_ = 0;
  local_78.keep_size_after = 0;
  local_78.offset = 0;
  local_78.read_pos = 0;
  local_78.read_ahead = 0;
  local_78.buffer = (uint8_t *)0x0;
  local_78.size = 0;
  local_78.keep_size_before = 0;
  local_78.sons_count = 0;
  local_78._116_4_ = 0;
  _Var1 = lz_encoder_prepare(&local_78,(lzma_allocator *)0x0,lz_options);
  uVar2 = 0xffffffffffffffff;
  if (!_Var1) {
    uVar2 = (local_78._8_8_ & 0xffffffff) +
            (ulong)(local_78.sons_count + local_78.hash_size_sum) * 4 + 0xd8;
  }
  return uVar2;
}

Assistant:

extern uint64_t
lzma_lz_encoder_memusage(const lzma_lz_options *lz_options)
{
	// Old buffers must not exist when calling lz_encoder_prepare().
	lzma_mf mf = { NULL };

	// Setup the size information into mf.
	if (lz_encoder_prepare(&mf, NULL, lz_options))
		return UINT64_MAX;

	// Calculate the memory usage.
	return (uint64_t)(mf.hash_size_sum + mf.sons_count)
				* sizeof(uint32_t)
			+ (uint64_t)(mf.size) + sizeof(lzma_coder);
}